

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O0

ON_Linetype * __thiscall ON_Linetype::DuplicateLinetype(ON_Linetype *this)

{
  ON_Linetype *this_00;
  ON_Linetype *rc;
  ON_Linetype *this_local;
  
  this_00 = (ON_Linetype *)operator_new(0xb0);
  ON_Linetype(this_00,this);
  if (this_00 != (ON_Linetype *)0x0) {
    ON_ModelComponent::ClearName((ON_ModelComponent *)this_00);
    ON_ModelComponent::ClearId((ON_ModelComponent *)this_00);
    this_00->m_is_locked_bits = '\0';
  }
  return this_00;
}

Assistant:

ON_Linetype* ON_Linetype::DuplicateLinetype() const
{
  ON_Linetype* rc = new ON_Linetype(*this);
  if (rc)
  {
    rc->ClearName();
    rc->ClearId();
    rc->m_is_locked_bits = 0;
  }
  return rc;
}